

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* google::protobuf::compiler::objectivec::anon_unknown_0::UpperSegments(void)

{
  int iVar1;
  anon_class_1_0_00000001 local_9;
  
  if (objectivec::(anonymous_namespace)::UpperSegments()::words == '\0') {
    iVar1 = __cxa_guard_acquire(&objectivec::(anonymous_namespace)::UpperSegments()::words);
    if (iVar1 != 0) {
      UpperSegments::words = UpperSegments::anon_class_1_0_00000001::operator()(&local_9);
      __cxa_guard_release(&objectivec::(anonymous_namespace)::UpperSegments()::words);
    }
  }
  return UpperSegments::words;
}

Assistant:

const absl::flat_hash_set<absl::string_view>& UpperSegments() {
  static const auto* words = [] {
    auto* words = new absl::flat_hash_set<absl::string_view>();

    for (const auto word : kUpperSegmentsList) {
      words->emplace(word);
    }
    return words;
  }();
  return *words;
}